

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_bool duckdb_miniz::mz_zip_reader_init(mz_zip_archive *pZip,mz_uint64 size,mz_uint flags)

{
  mz_bool mVar1;
  mz_bool mVar2;
  
  mVar2 = 0;
  if (pZip != (mz_zip_archive *)0x0) {
    if (pZip->m_pRead == (mz_file_read_func)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      mVar2 = 0;
    }
    else {
      mVar1 = mz_zip_reader_init_internal(pZip,flags);
      if (mVar1 != 0) {
        pZip->m_zip_type = MZ_ZIP_TYPE_USER;
        pZip->m_archive_size = size;
        mVar2 = mz_zip_reader_read_central_dir(pZip,flags);
        if (mVar2 == 0) {
          mz_zip_reader_end_internal(pZip,0);
          mVar2 = 0;
        }
        else {
          mVar2 = 1;
        }
      }
    }
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_reader_init(mz_zip_archive *pZip, mz_uint64 size, mz_uint flags)
{
    if ((!pZip) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_reader_init_internal(pZip, flags))
        return MZ_FALSE;

    pZip->m_zip_type = MZ_ZIP_TYPE_USER;
    pZip->m_archive_size = size;

    if (!mz_zip_reader_read_central_dir(pZip, flags))
    {
        mz_zip_reader_end_internal(pZip, MZ_FALSE);
        return MZ_FALSE;
    }

    return MZ_TRUE;
}